

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-obj.c
# Opt level: O2

void use_aux(command *cmd,object *obj,use use,wchar_t snd)

{
  uint32_t *puVar1;
  byte *pbVar2;
  loc grid;
  loc grid_00;
  loc grid_01;
  loc grid_02;
  bool bVar3;
  use uVar4;
  _Bool _Var5;
  _Bool _Var6;
  _Bool _Var7;
  char cVar8;
  uint16_t uVar9;
  wchar_t wVar10;
  uint32_t uVar11;
  trap_kind_conflict *ptVar12;
  effect *peVar13;
  undefined7 extraout_var;
  undefined6 extraout_var_00;
  player_upkeep *ppVar14;
  object *poVar15;
  int iVar16;
  long lVar17;
  wchar_t *pwVar18;
  char *fmt;
  char *pcVar19;
  player *p;
  undefined1 aware;
  byte bVar20;
  short sVar21;
  char *pcVar22;
  wchar_t beam;
  bool bVar23;
  source sVar24;
  source origin;
  _Bool ident;
  _Bool none_left;
  object *obj_local;
  object *work_obj;
  undefined1 local_c5;
  use local_c4;
  wchar_t local_c0;
  wchar_t dir;
  trap_kind_conflict *local_b8;
  undefined4 local_ac;
  object *first_remainder;
  uint local_9c;
  command *local_98;
  effect *local_90;
  object *wcopy;
  
  obj_local = obj;
  local_c0 = snd;
  local_90 = object_effect(obj);
  _Var5 = object_is_carried(player,obj);
  none_left = false;
  dir = L'\x05';
  ptVar12 = lookup_trap("glyph of warding");
  local_98 = cmd;
  wVar10 = cmd_get_arg_item((command_conflict *)cmd,"item",&obj_local);
  if (wVar10 != L'\0') {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/timschumi[P]angband/src/cmd-obj.c"
                  ,0x19d,"void use_aux(struct command *, struct object *, enum use, int)");
  }
  _Var6 = object_flavor_is_aware(obj_local);
  _Var7 = tval_is_wand(obj_local);
  bVar23 = true;
  local_c5 = _Var6;
  if (((!_Var7) && (_Var7 = tval_is_rod(obj_local), !_Var7 && !_Var6)) &&
     ((obj_local->effect == (effect *)0x0 || (obj_local->known->effect != obj_local->effect)))) {
    if (obj_local->activation == (activation *)0x0) {
      bVar23 = false;
    }
    else {
      bVar23 = obj_local->known->activation == obj_local->activation;
    }
  }
  _Var6 = obj_needs_aim(obj_local);
  if (_Var6) {
    if (bVar23) {
      wVar10 = cmd_get_target((command_conflict *)local_98,"target",&dir);
      if (wVar10 != L'\0') {
        return;
      }
    }
    else {
      uVar11 = Rand_div(8);
      dir = (wchar_t)ddd[(int)uVar11];
    }
    player_confuse_dir(player,&dir,false);
  }
  local_b8 = ptVar12;
  track_object(player->upkeep,obj_local);
  poVar15 = obj_local;
  if (local_90 == (effect *)0x0) {
    __assert_fail("effect",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/timschumi[P]angband/src/cmd-obj.c"
                  ,0x1b8,"void use_aux(struct command *, struct object *, enum use, int)");
  }
  local_c4 = use;
  if (USE_CHARGE < use) goto LAB_0012eb15;
  _Var6 = tval_is_rod(obj_local);
  if (_Var6) {
    bVar23 = true;
    pcVar22 = "zap the rod";
    pcVar19 = (char *)0x0;
LAB_0012ea46:
    bVar3 = false;
  }
  else {
    _Var6 = tval_is_wand(poVar15);
    if (_Var6) {
      pcVar19 = "wand";
      pcVar22 = "use the wand";
      bVar23 = false;
      goto LAB_0012ea46;
    }
    _Var6 = tval_is_staff(poVar15);
    pcVar22 = "activate it";
    bVar23 = !_Var6;
    pcVar19 = (char *)0x0;
    bVar3 = bVar23;
    if (_Var6) {
      pcVar22 = "use the staff";
      pcVar19 = "staff";
    }
  }
  wVar10 = get_use_device_chance(poVar15);
  uVar11 = Rand_div(1000);
  if (uVar11 + L'\x01' < wVar10) {
    event_signal(EVENT_INPUT_FLUSH);
    fmt = "You failed to %s properly.";
    pcVar19 = pcVar22;
  }
  else {
    if ((bVar23) || (0 < poVar15->pval)) {
      if (bVar3) {
        peVar13 = poVar15->effect;
        lVar17 = 0xf0;
        if (peVar13 == (effect *)0x0) {
          peVar13 = (effect *)poVar15->activation;
          lVar17 = 0x100;
          if (peVar13 == (effect *)0x0) goto LAB_0012eb15;
        }
        *(effect **)(poVar15->known->flags + lVar17 + -0x4c) = peVar13;
      }
LAB_0012eb15:
      uVar4 = local_c4;
      wVar10 = L'\n';
      if (obj_local->tval != '\x18') {
        wVar10 = L'\0';
      }
      beam = L'\x14';
      if (obj_local->tval != '\x17') {
        beam = wVar10;
      }
      ident = false;
      first_remainder = (object *)0x0;
      if (_Var5) {
        cVar8 = gear_to_label(player,obj_local);
        local_ac = (undefined4)CONCAT71(extraout_var,cVar8);
        if (uVar4 < USE_SINGLE) {
          local_9c = (uint)obj_local->number;
        }
        else {
          uVar9 = object_pack_total(player,obj_local,false,&first_remainder);
          local_9c = (uint)CONCAT62(extraout_var_00,uVar9);
          if ((first_remainder != (object *)0x0) && (uVar9 == first_remainder->number)) {
            first_remainder = (object *)0x0;
          }
        }
      }
      else {
        local_9c = (uint)obj_local->number;
        local_ac = 0;
      }
      if (obj_local->artifact == (artifact *)0x0) {
        pwVar18 = &obj_local->kind->level;
      }
      else {
        pwVar18 = &obj_local->artifact->level;
      }
      wVar10 = *pwVar18;
      if (obj_local->activation == (activation *)0x0) {
        if ((obj_local->kind->effect_msg == (char *)0x0) &&
           ((obj_local->kind->vis_msg == (char *)0x0 || (player->timed[2] != 0)))) {
          sound(local_c0);
        }
        else {
          msgt(local_c0,"%s");
        }
      }
      else {
        msgt(local_c0,"You activate it.");
        if ((obj_local->activation != (activation *)0x0) &&
           (pcVar19 = obj_local->activation->message, pcVar19 != (char *)0x0)) {
          if ((obj_local->artifact == (artifact *)0x0) ||
             (pcVar22 = obj_local->artifact->alt_msg, pcVar22 == (char *)0x0)) {
            pcVar22 = pcVar19;
          }
          print_custom_message(obj_local,pcVar22,L'\0',player);
        }
      }
      aware = local_c5;
      iVar16 = (player->state).skills[2] - wVar10;
      wVar10 = L'\0';
      if (-2 < iVar16) {
        wVar10 = iVar16 / 2;
      }
      if (_Var5) {
        work_obj = object_new();
        object_copy(work_obj,obj_local);
        aware = local_c5;
        work_obj->oidx = 0;
        if (obj_local->known != (object *)0x0) {
          poVar15 = object_new();
          work_obj->known = poVar15;
          object_copy(poVar15,obj_local->known);
          work_obj->known->oidx = 0;
        }
        sVar21 = 0;
        bVar23 = false;
      }
      else if (uVar4 == USE_SINGLE) {
        sVar21 = 0;
        work_obj = floor_object_for_use(player,obj_local,L'\x01',false,&none_left);
        bVar23 = true;
      }
      else {
        if (uVar4 == USE_CHARGE) {
          sVar21 = obj_local->pval;
          obj_local->pval = sVar21 + -1;
LAB_0012ed94:
          bVar23 = true;
        }
        else {
          if (uVar4 == USE_TIMEOUT) {
            sVar21 = obj_local->timeout;
            iVar16 = randcalc(obj_local->time,0,RANDOMISE);
            obj_local->timeout = obj_local->timeout + (short)iVar16;
            goto LAB_0012ed94;
          }
          sVar21 = 0;
          bVar23 = false;
        }
        work_obj = object_new();
        object_copy(work_obj,obj_local);
        work_obj->oidx = 0;
        if (obj_local->known != (object *)0x0) {
          poVar15 = object_new();
          work_obj->known = poVar15;
          object_copy(poVar15,obj_local->known);
          work_obj->known->oidx = 0;
        }
      }
      target_fix();
      sVar24 = source_player();
      origin.which = sVar24.which;
      origin._4_4_ = 0;
      origin.what = sVar24.what;
      _Var6 = effect_do(local_90,origin,obj_local,&ident,(_Bool)aware,dir,beam,wVar10,local_98);
      target_release();
      if (_Var6) {
        if (local_c4 != USE_SINGLE) {
LAB_0012efc0:
          _Var7 = tval_is_wearable(work_obj);
          if (_Var7) {
            update_player_object_knowledge(player);
          }
          else {
            if (((_Bool)aware == false) && (ident == true)) {
              object_learn_on_use(player,work_obj);
              bVar3 = true;
              bVar20 = 0;
              goto LAB_0012f00b;
            }
            object_flavor_tried(work_obj);
          }
          bVar20 = 0;
          bVar3 = false;
          goto LAB_0012f00b;
        }
        bVar3 = true;
        bVar20 = 1;
        if ((_Bool)aware == false) goto LAB_0012ef36;
LAB_0012f010:
        if (bVar23) goto LAB_0012f019;
        if (!_Var5) {
          __assert_fail("!from_floor",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/timschumi[P]angband/src/cmd-obj.c"
                        ,0x28a,"void use_aux(struct command *, struct object *, enum use, int)");
        }
        if (local_c4 == USE_CHARGE) {
          obj_local->pval = obj_local->pval + -1;
          work_obj->pval = work_obj->pval + -1;
          if (bVar3) goto LAB_0012f023;
LAB_0012f0d6:
          ptVar12 = local_b8;
          inven_item_charges(work_obj);
        }
        else {
          if (local_c4 == USE_TIMEOUT) {
            iVar16 = randcalc(obj_local->time,0,RANDOMISE);
            obj_local->timeout = obj_local->timeout + (short)iVar16;
            work_obj->timeout = work_obj->timeout + (short)iVar16;
          }
          else {
            if (bVar20 == 0) {
              bVar20 = 0;
              goto LAB_0012f019;
            }
            wcopy = gear_object_for_use(player,obj_local,L'\x01',false,&none_left);
            if (wcopy->known != (object *)0x0) {
              object_delete((chunk *)cave,(chunk *)player->cave,&wcopy->known);
            }
            object_delete((chunk *)cave,(chunk *)player->cave,&wcopy);
            bVar20 = 1;
          }
          ptVar12 = local_b8;
          if (bVar3) goto LAB_0012f023;
        }
      }
      else {
        if (bVar23) {
          if (local_c4 == USE_SINGLE) {
            wcopy = object_new();
            object_copy(wcopy,work_obj);
            if (work_obj->known != (object *)0x0) {
              poVar15 = object_new();
              wcopy->known = poVar15;
              object_copy(poVar15,work_obj->known);
            }
            if (_Var5) {
              inven_carry(player,wcopy,true,false);
            }
            else {
              grid.x = (player->grid).x;
              grid.y = (player->grid).y;
              drop_near((chunk *)cave,&wcopy,L'\0',grid,false,true);
            }
          }
          else if (local_c4 == USE_CHARGE) {
            obj_local->pval = sVar21;
          }
          else if (local_c4 == USE_TIMEOUT) {
            obj_local->timeout = sVar21;
          }
        }
        if (((_Bool)aware != false) || (ident == false)) {
          if (work_obj->known != (object *)0x0) {
            object_delete((chunk *)player->cave,(chunk *)0x0,&work_obj->known);
          }
          object_delete((chunk *)cave,(chunk *)player->cave,&work_obj);
          if (!bVar23) {
            return;
          }
          if (!_Var5) {
            puVar1 = &player->upkeep->redraw;
            *puVar1 = *puVar1 | 0x200000;
            return;
          }
          __assert_fail("from_floor",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/timschumi[P]angband/src/cmd-obj.c"
                        ,0x268,"void use_aux(struct command *, struct object *, enum use, int)");
        }
        if (local_c4 != USE_SINGLE) goto LAB_0012efc0;
LAB_0012ef36:
        object_learn_on_use(player,work_obj);
        bVar20 = 1;
        bVar3 = true;
LAB_0012f00b:
        if (_Var6) goto LAB_0012f010;
LAB_0012f019:
        ptVar12 = local_b8;
        if (bVar3) {
LAB_0012f023:
          ptVar12 = local_b8;
          object_desc((char *)&wcopy,0x50,work_obj,(local_9c - (_Var6 & bVar20)) * 0x10000 | 0x443,
                      player);
          if (_Var5) {
            if (first_remainder == (object *)0x0) {
              pcVar19 = "You have %s (%c).";
              cVar8 = (char)local_ac;
            }
            else {
              cVar8 = gear_to_label(player,first_remainder);
              pcVar19 = "You have %s (1st %c).";
            }
            msg(pcVar19,&wcopy,(ulong)(uint)(int)cVar8);
          }
          else {
            msg("You see %s.");
          }
        }
        else if (_Var6 && local_c4 == USE_CHARGE) {
          if (_Var5) goto LAB_0012f0d6;
          floor_item_charges(work_obj);
        }
      }
      if (work_obj->known != (object *)0x0) {
        object_delete((chunk *)player->cave,(chunk *)0x0,&work_obj->known);
      }
      object_delete((chunk *)cave,(chunk *)player->cave,&work_obj);
      goto LAB_0012f1ce;
    }
    event_signal(EVENT_INPUT_FLUSH);
    fmt = "The %s has no charges left.";
  }
  msg(fmt,pcVar19);
  ptVar12 = local_b8;
LAB_0012f1ce:
  p = player;
  ppVar14 = player->upkeep;
  ppVar14->energy_use = (uint)z_info->move_energy;
  if (((~_Var5 | none_left) & 1U) == 0) {
    apply_autoinscription(p,obj_local);
    ppVar14 = player->upkeep;
    p = player;
  }
  *(byte *)&ppVar14->notice = (byte)ppVar14->notice | 1;
  pbVar2 = (byte *)((long)&ppVar14->redraw + 2);
  *pbVar2 = *pbVar2 | 0x26;
  grid_00.x = (p->grid).x;
  grid_00.y = (p->grid).y;
  _Var5 = square_trap_specific((chunk *)cave,grid_00,ptVar12->tidx);
  if ((_Var5) &&
     (grid_01.x = (player->grid).x, grid_01.y = (player->grid).y,
     poVar15 = square_object(cave,grid_01), poVar15 != (object *)0x0)) {
    grid_02.x = (player->grid).x;
    grid_02.y = (player->grid).y;
    push_object(grid_02);
  }
  return;
}

Assistant:

static void use_aux(struct command *cmd, struct object *obj, enum use use,
					int snd)
{
	struct effect *effect = object_effect(obj);
	bool from_floor = !object_is_carried(player, obj);
	bool can_use = true;
	bool was_aware;
	bool known_aim = false;
	bool none_left = false;
	int dir = 5;
	struct trap_kind *rune = lookup_trap("glyph of warding");

	/* Get arguments */
	if (cmd_get_arg_item(cmd, "item", &obj) != CMD_OK) assert(0);

	was_aware = object_flavor_is_aware(obj);

	/* Determine whether we know an item needs to be be aimed */
	if (tval_is_wand(obj) || tval_is_rod(obj) || was_aware ||
		(obj->effect && (obj->known->effect == obj->effect)) ||
		(obj->activation && (obj->known->activation == obj->activation))) {
		known_aim = true;
	}

	if (obj_needs_aim(obj)) {
		/* Unknown things with no obvious aim get a random direction */
		if (!known_aim) {
			dir = ddd[randint0(8)];
		} else if (cmd_get_target(cmd, "target", &dir) != CMD_OK) {
			return;
		}

		/* Confusion wrecks aim */
		player_confuse_dir(player, &dir, false);
	}

	/* track the object used */
	track_object(player->upkeep, obj);

	/* Verify effect */
	assert(effect);

	/* Check for use if necessary */
	if ((use == USE_CHARGE) || (use == USE_TIMEOUT)) {
		can_use = check_devices(obj);
	}

	/* Execute the effect */
	if (can_use) {
		int beam = beam_chance(obj->tval);
		int boost, level, charges = 0;
		uint16_t number;
		bool ident = false, describe = false, deduct_before, used;
		struct object *work_obj;
		struct object *first_remainder = NULL;
		char label = '\0';

		if (from_floor) {
			number = obj->number;
		} else {
			label = gear_to_label(player, obj);
			/*
			 * Show an aggregate total if the description doesn't
			 * have a charge/recharging notice specific to the
			 * stack.
			 */
			if (use != USE_CHARGE && use != USE_TIMEOUT) {
				number = object_pack_total(player, obj, false,
					&first_remainder);
				if (first_remainder && first_remainder->number
						== number) {
					first_remainder = NULL;
				}
			} else {
				number = obj->number;
			}
		}

		/* Get the level */
		if (obj->artifact)
			level = obj->artifact->level;
		else
			level = obj->kind->level;

		/* Sound and/or message */
		if (obj->activation) {
			msgt(snd, "You activate it.");
			activation_message(obj, player);
		} else if (obj->kind->effect_msg) {
			msgt(snd, "%s", obj->kind->effect_msg);
		} else if (obj->kind->vis_msg && !player->timed[TMD_BLIND]) {
			msgt(snd, "%s", obj->kind->vis_msg);
		} else {
			/* Make a noise! */
			sound(snd);
		}

		/* Boost damage effects if skill > difficulty */
		boost = MAX((player->state.skills[SKILL_DEVICE] - level) / 2, 0);

		/*
		 * If the object is on the floor, tentatively deduct the
		 * amount used - the effect could leave the object inaccessible
		 * making it difficult to do after a successful use.  For the
		 * the same reason, get a copy of the object to use for
		 * propagating knowledge and messaging (also do so for items in
		 * the pack to keep later logic simpler).  Don't do the
		 * deduction for an object in the pack because the
		 * rearrangement of the pack, if using a stack of one single
		 * use item, can distract the player, see
		 * https://github.com/angband/angband/issues/5543 .
		 * If effects change so that the originating object can be
		 * destroyed even if in the pack, the deduction would have to
		 * be done here if the item is in the pack as well.
		 */
		if (from_floor) {
			if (use == USE_SINGLE) {
				deduct_before = true;
				work_obj = floor_object_for_use(player, obj, 1,
					false, &none_left);
			} else {
				if (use == USE_CHARGE) {
					deduct_before = true;
					charges = obj->pval;
					/* Use a single charge */
					obj->pval--;
				} else if (use == USE_TIMEOUT) {
					deduct_before = true;
					charges = obj->timeout;
					obj->timeout += randcalc(obj->time, 0,
						RANDOMISE);
				} else {
					deduct_before = false;
				}
				work_obj = object_new();
				object_copy(work_obj, obj);
				work_obj->oidx = 0;
				if (obj->known) {
					work_obj->known = object_new();
					object_copy(work_obj->known,
						obj->known);
					work_obj->known->oidx = 0;
				}
			}
		} else {
			deduct_before = false;
			work_obj = object_new();
			object_copy(work_obj, obj);
			work_obj->oidx = 0;
			if (obj->known) {
				work_obj->known = object_new();
				object_copy(work_obj->known, obj->known);
				work_obj->known->oidx = 0;
			}
		}

		/* Do effect; use original not copy (proj. effect handling) */
		target_fix();
		used = effect_do(effect,
							source_player(),
							obj,
							&ident,
							was_aware,
							dir,
							beam,
							boost,
							cmd);
		target_release();

		if (!used) {
			if (deduct_before) {
				/* Restore the tentative deduction. */
				if (use == USE_SINGLE) {
					/*
					 * Drop/stash copy to simplify
					 * subsequent logic.
					 */
					struct object *wcopy = object_new();

					object_copy(wcopy, work_obj);
					if (work_obj->known) {
						wcopy->known = object_new();
						object_copy(wcopy->known,
							work_obj->known);
					}
					if (from_floor) {
						drop_near(cave, &wcopy, 0,
							player->grid, false,
							true);
					} else {
						inven_carry(player, wcopy,
							true, false);
					}
				} else if (use == USE_CHARGE) {
					obj->pval = charges;
				} else if (use == USE_TIMEOUT) {
					obj->timeout = charges;
				}
			}

			/*
			 * Quit if the item wasn't used and no knowledge was
			 * gained
			 */
			if (was_aware || !ident) {
				if (work_obj->known) {
					object_delete(player->cave, NULL, &work_obj->known);
				}
				object_delete(cave, player->cave, &work_obj);
				/*
				 * Selection of effect's target may have
				 * triggered an update to windows while the
				 * tentative deduction was in effect; signal
				 * another update to remedy that.
				 */
				if (deduct_before) {
					assert(from_floor);
					player->upkeep->redraw |= (PR_OBJECT);
				}
				return;
			}
		}

		/* Increase knowledge */
		if (use == USE_SINGLE) {
			/* Single use items are automatically learned */
			if (!was_aware) {
				object_learn_on_use(player, work_obj);
			}
			describe = true;
		} else {
			/* Wearables may need update, other things become known or tried */
			if (tval_is_wearable(work_obj)) {
				update_player_object_knowledge(player);
			} else if (!was_aware && ident) {
				object_learn_on_use(player, work_obj);
				describe = true;
			} else {
				object_flavor_tried(work_obj);
			}
		}

		/*
		 * Use up, deduct charge, or apply timeout if it wasn't
		 * done before.  For charges or timeouts, also have to change
		 * work_obj since it is used for messaging (for single use
		 * items, ODESC_ALTNUM means that the work_obj's number doesn't
		 * need to be adjusted).
		 */
		if (used && !deduct_before) {
			assert(!from_floor);
			if (use == USE_CHARGE) {
				obj->pval--;
				work_obj->pval--;
			} else if (use == USE_TIMEOUT) {
				int adj = randcalc(obj->time, 0, RANDOMISE);

				obj->timeout += adj;
				work_obj->timeout += adj;
			} else if (use == USE_SINGLE) {
				struct object *used_obj = gear_object_for_use(
					player, obj, 1, false, &none_left);

				if (used_obj->known) {
					object_delete(cave, player->cave,
						&used_obj->known);
				}
				object_delete(cave, player->cave, &used_obj);
			}
		}

		if (describe) {
			/*
			 * Describe what's left of single use items or newly
			 * identified items of all kinds.
			 */
			char name[80];

			object_desc(name, sizeof(name), work_obj,
				ODESC_PREFIX | ODESC_FULL | ODESC_ALTNUM |
				((number + ((used && use == USE_SINGLE) ?
				-1 : 0)) << 16), player);
			if (from_floor) {
				/* Print a message */
				msg("You see %s.", name);
			} else if (first_remainder) {
				label = gear_to_label(player, first_remainder);
				msg("You have %s (1st %c).", name, label);
			} else {
				msg("You have %s (%c).", name, label);
			}
		} else if (used && use == USE_CHARGE) {
			/* Describe charges */
			if (from_floor)
				floor_item_charges(work_obj);
			else
				inven_item_charges(work_obj);
		}

		/* Clean up created copy. */
		if (work_obj->known)
			object_delete(player->cave, NULL, &work_obj->known);
		object_delete(cave, player->cave, &work_obj);
	}

	/* Use the turn */
	player->upkeep->energy_use = z_info->move_energy;

	/* Autoinscribe if we are guaranteed to still have any */
	if (!none_left && !from_floor)
		apply_autoinscription(player, obj);

	/* Mark as tried and redisplay */
	player->upkeep->notice |= (PN_COMBINE);
	player->upkeep->redraw |= (PR_INVEN | PR_EQUIP | PR_OBJECT);

	/* Hack to make Glyph of Warding work properly */
	if (square_trap_specific(cave, player->grid, rune->tidx)) {
		/* Push objects off the grid */
		if (square_object(cave, player->grid))
			push_object(player->grid);
	}
}